

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_entry_finalize(zip_t *zip,zip_entry_mark_t *entry_mark,size_t n)

{
  mz_uint64 *__ptr;
  mz_uint64 *nxt_index;
  void *__ptr_00;
  size_t *length;
  ssize_t index;
  mz_uint64 *local_header_ofs_array;
  size_t i;
  size_t n_local;
  zip_entry_mark_t *entry_mark_local;
  zip_t *zip_local;
  
  __ptr = (mz_uint64 *)calloc(n,8);
  if (__ptr == (mz_uint64 *)0x0) {
    zip_local._4_4_ = -0x15;
  }
  else {
    for (local_header_ofs_array = (mz_uint64 *)0x0; local_header_ofs_array < n;
        local_header_ofs_array = (mz_uint64 *)((long)local_header_ofs_array + 1)) {
      __ptr[(long)local_header_ofs_array] =
           entry_mark[(long)local_header_ofs_array].m_local_header_ofs;
      nxt_index = (mz_uint64 *)zip_sort(__ptr,(ssize_t)local_header_ofs_array);
      if (nxt_index != local_header_ofs_array) {
        zip_index_update(entry_mark,(ssize_t)local_header_ofs_array,(ssize_t)nxt_index);
      }
      entry_mark[(long)local_header_ofs_array].file_index = (ssize_t)nxt_index;
    }
    __ptr_00 = calloc(n,8);
    if (__ptr_00 == (void *)0x0) {
      if (__ptr != (mz_uint64 *)0x0) {
        free(__ptr);
      }
      zip_local._4_4_ = -0x15;
    }
    else {
      for (local_header_ofs_array = (mz_uint64 *)0x0; local_header_ofs_array < (mz_uint64 *)(n - 1);
          local_header_ofs_array = (mz_uint64 *)((long)local_header_ofs_array + 1)) {
        *(mz_uint64 *)((long)__ptr_00 + (long)local_header_ofs_array * 8) =
             __ptr[(long)local_header_ofs_array + 1] - __ptr[(long)local_header_ofs_array];
      }
      *(mz_uint64 *)((long)__ptr_00 + (n - 1) * 8) = (zip->archive).m_archive_size - __ptr[n - 1];
      for (local_header_ofs_array = (mz_uint64 *)0x0; local_header_ofs_array < n;
          local_header_ofs_array = (mz_uint64 *)((long)local_header_ofs_array + 1)) {
        entry_mark[(long)local_header_ofs_array].lf_length =
             *(size_t *)((long)__ptr_00 + entry_mark[(long)local_header_ofs_array].file_index * 8);
      }
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      if (__ptr != (mz_uint64 *)0x0) {
        free(__ptr);
      }
      zip_local._4_4_ = 0;
    }
  }
  return zip_local._4_4_;
}

Assistant:

static int zip_entry_finalize(struct zip_t *zip,
                              struct zip_entry_mark_t *entry_mark,
                              const size_t n) {
  size_t i = 0;
  mz_uint64 *local_header_ofs_array = (mz_uint64 *)calloc(n, sizeof(mz_uint64));
  if (!local_header_ofs_array) {
    return ZIP_EOOMEM;
  }

  for (i = 0; i < n; ++i) {
    local_header_ofs_array[i] = entry_mark[i].m_local_header_ofs;
    ssize_t index = zip_sort(local_header_ofs_array, i);

    if ((size_t)index != i) {
      zip_index_update(entry_mark, i, index);
    }
    entry_mark[i].file_index = index;
  }

  size_t *length = (size_t *)calloc(n, sizeof(size_t));
  if (!length) {
    CLEANUP(local_header_ofs_array);
    return ZIP_EOOMEM;
  }
  for (i = 0; i < n - 1; i++) {
    length[i] =
        (size_t)(local_header_ofs_array[i + 1] - local_header_ofs_array[i]);
  }
  length[n - 1] =
      (size_t)(zip->archive.m_archive_size - local_header_ofs_array[n - 1]);

  for (i = 0; i < n; i++) {
    entry_mark[i].lf_length = length[entry_mark[i].file_index];
  }

  CLEANUP(length);
  CLEANUP(local_header_ofs_array);
  return 0;
}